

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::FileOptions::InternalSerializeWithCachedSizesToArray
          (FileOptions *this,bool deterministic,uint8 *target)

{
  bool bVar1;
  int iVar2;
  FileOptions_OptimizeMode value;
  uint uVar3;
  char *pcVar4;
  string *psVar5;
  UninterpretedOption *value_00;
  UnknownFieldSet *unknown_fields;
  uint local_48;
  uint n;
  uint i;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  FileOptions *this_local;
  
  uVar3 = (this->_has_bits_).has_bits_[0];
  _i = target;
  if ((uVar3 & 1) != 0) {
    java_package_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    java_package_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar2,SERIALIZE,"google.protobuf.FileOptions.java_package");
    psVar5 = java_package_abi_cxx11_(this);
    _i = internal::WireFormatLite::WriteStringToArray(1,psVar5,target);
  }
  if ((uVar3 & 2) != 0) {
    java_outer_classname_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    java_outer_classname_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar2,SERIALIZE,"google.protobuf.FileOptions.java_outer_classname");
    psVar5 = java_outer_classname_abi_cxx11_(this);
    _i = internal::WireFormatLite::WriteStringToArray(8,psVar5,_i);
  }
  if ((uVar3 & 0x8000) != 0) {
    value = optimize_for(this);
    _i = internal::WireFormatLite::WriteEnumToArray(9,value,_i);
  }
  if ((uVar3 & 0x80) != 0) {
    bVar1 = java_multiple_files(this);
    _i = internal::WireFormatLite::WriteBoolToArray(10,bVar1,_i);
  }
  if ((uVar3 & 4) != 0) {
    go_package_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    go_package_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar2,SERIALIZE,"google.protobuf.FileOptions.go_package");
    psVar5 = go_package_abi_cxx11_(this);
    _i = internal::WireFormatLite::WriteStringToArray(0xb,psVar5,_i);
  }
  if ((uVar3 & 0x400) != 0) {
    bVar1 = cc_generic_services(this);
    _i = internal::WireFormatLite::WriteBoolToArray(0x10,bVar1,_i);
  }
  if ((uVar3 & 0x800) != 0) {
    bVar1 = java_generic_services(this);
    _i = internal::WireFormatLite::WriteBoolToArray(0x11,bVar1,_i);
  }
  if ((uVar3 & 0x1000) != 0) {
    bVar1 = py_generic_services(this);
    _i = internal::WireFormatLite::WriteBoolToArray(0x12,bVar1,_i);
  }
  if ((uVar3 & 0x100) != 0) {
    bVar1 = java_generate_equals_and_hash(this);
    _i = internal::WireFormatLite::WriteBoolToArray(0x14,bVar1,_i);
  }
  if ((uVar3 & 0x2000) != 0) {
    bVar1 = deprecated(this);
    _i = internal::WireFormatLite::WriteBoolToArray(0x17,bVar1,_i);
  }
  if ((uVar3 & 0x200) != 0) {
    bVar1 = java_string_check_utf8(this);
    _i = internal::WireFormatLite::WriteBoolToArray(0x1b,bVar1,_i);
  }
  if ((uVar3 & 0x4000) != 0) {
    bVar1 = cc_enable_arenas(this);
    _i = internal::WireFormatLite::WriteBoolToArray(0x1f,bVar1,_i);
  }
  if ((uVar3 & 8) != 0) {
    objc_class_prefix_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    objc_class_prefix_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar2,SERIALIZE,"google.protobuf.FileOptions.objc_class_prefix");
    psVar5 = objc_class_prefix_abi_cxx11_(this);
    _i = internal::WireFormatLite::WriteStringToArray(0x24,psVar5,_i);
  }
  if ((uVar3 & 0x10) != 0) {
    csharp_namespace_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    csharp_namespace_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar2,SERIALIZE,"google.protobuf.FileOptions.csharp_namespace");
    psVar5 = csharp_namespace_abi_cxx11_(this);
    _i = internal::WireFormatLite::WriteStringToArray(0x25,psVar5,_i);
  }
  if ((uVar3 & 0x20) != 0) {
    swift_prefix_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    swift_prefix_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar2,SERIALIZE,"google.protobuf.FileOptions.swift_prefix");
    psVar5 = swift_prefix_abi_cxx11_(this);
    _i = internal::WireFormatLite::WriteStringToArray(0x27,psVar5,_i);
  }
  if ((uVar3 & 0x40) != 0) {
    php_class_prefix_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    php_class_prefix_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar2,SERIALIZE,"google.protobuf.FileOptions.php_class_prefix");
    psVar5 = php_class_prefix_abi_cxx11_(this);
    _i = internal::WireFormatLite::WriteStringToArray(0x28,psVar5,_i);
  }
  local_48 = 0;
  uVar3 = uninterpreted_option_size(this);
  for (; local_48 < uVar3; local_48 = local_48 + 1) {
    value_00 = uninterpreted_option(this,local_48);
    _i = internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<google::protobuf::UninterpretedOption>
                   (999,value_00,deterministic,_i);
  }
  _i = internal::ExtensionSet::InternalSerializeWithCachedSizesToArray
                 (&this->_extensions_,1000,0x20000000,deterministic,_i);
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = FileOptions::unknown_fields(this);
    _i = internal::WireFormat::SerializeUnknownFieldsToArray(unknown_fields,_i);
  }
  return _i;
}

Assistant:

::google::protobuf::uint8* FileOptions::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FileOptions)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string java_package = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->java_package().data(), this->java_package().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.java_package");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->java_package(), target);
  }

  // optional string java_outer_classname = 8;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->java_outer_classname().data(), this->java_outer_classname().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.java_outer_classname");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        8, this->java_outer_classname(), target);
  }

  // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
  if (cached_has_bits & 0x00008000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      9, this->optimize_for(), target);
  }

  // optional bool java_multiple_files = 10 [default = false];
  if (cached_has_bits & 0x00000080u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(10, this->java_multiple_files(), target);
  }

  // optional string go_package = 11;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->go_package().data(), this->go_package().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.go_package");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        11, this->go_package(), target);
  }

  // optional bool cc_generic_services = 16 [default = false];
  if (cached_has_bits & 0x00000400u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(16, this->cc_generic_services(), target);
  }

  // optional bool java_generic_services = 17 [default = false];
  if (cached_has_bits & 0x00000800u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(17, this->java_generic_services(), target);
  }

  // optional bool py_generic_services = 18 [default = false];
  if (cached_has_bits & 0x00001000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(18, this->py_generic_services(), target);
  }

  // optional bool java_generate_equals_and_hash = 20 [deprecated = true];
  if (cached_has_bits & 0x00000100u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(20, this->java_generate_equals_and_hash(), target);
  }

  // optional bool deprecated = 23 [default = false];
  if (cached_has_bits & 0x00002000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(23, this->deprecated(), target);
  }

  // optional bool java_string_check_utf8 = 27 [default = false];
  if (cached_has_bits & 0x00000200u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(27, this->java_string_check_utf8(), target);
  }

  // optional bool cc_enable_arenas = 31 [default = false];
  if (cached_has_bits & 0x00004000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(31, this->cc_enable_arenas(), target);
  }

  // optional string objc_class_prefix = 36;
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->objc_class_prefix().data(), this->objc_class_prefix().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.objc_class_prefix");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        36, this->objc_class_prefix(), target);
  }

  // optional string csharp_namespace = 37;
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->csharp_namespace().data(), this->csharp_namespace().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.csharp_namespace");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        37, this->csharp_namespace(), target);
  }

  // optional string swift_prefix = 39;
  if (cached_has_bits & 0x00000020u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->swift_prefix().data(), this->swift_prefix().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.swift_prefix");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        39, this->swift_prefix(), target);
  }

  // optional string php_class_prefix = 40;
  if (cached_has_bits & 0x00000040u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->php_class_prefix().data(), this->php_class_prefix().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.php_class_prefix");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        40, this->php_class_prefix(), target);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (unsigned int i = 0, n = this->uninterpreted_option_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        999, this->uninterpreted_option(i), deterministic, target);
  }

  // Extension range [1000, 536870912)
  target = _extensions_.InternalSerializeWithCachedSizesToArray(
      1000, 536870912, deterministic, target);

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FileOptions)
  return target;
}